

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupCones(Gia_Man_t *p,int *pPos,int nPos,int fTrimPis)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  char *pcVar3;
  void *pvVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  Vec_Ptr_t *vLeaves;
  void **ppvVar7;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vRoots;
  int *piVar8;
  int *piVar9;
  Gia_Man_t *p_00;
  size_t sVar10;
  char *pcVar11;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *pVVar13;
  Gia_Obj_t *pGVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  
  vLeaves = (Vec_Ptr_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  vLeaves->pArray = ppvVar7;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  vNodes->pArray = ppvVar7;
  vRoots = (Vec_Ptr_t *)malloc(0x10);
  vRoots->nCap = 100;
  vRoots->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  vRoots->pArray = ppvVar7;
  uVar20 = (ulong)(uint)nPos;
  if (0 < nPos) {
    iVar15 = 0;
    uVar23 = 100;
    uVar18 = 0;
    do {
      uVar16 = pPos[uVar18];
      iVar1 = p->vCos->nSize;
      if (iVar1 - p->nRegs <= (int)uVar16) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar16 < 0) || (iVar1 <= (int)uVar16)) goto LAB_001ef02f;
      iVar1 = p->vCos->pArray[uVar16];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001eeff1;
      pGVar2 = p->pObjs;
      iVar22 = (int)uVar23;
      if (iVar15 == iVar22) {
        if (iVar22 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vRoots->pArray,0x80);
          }
          vRoots->pArray = ppvVar7;
          vRoots->nCap = 0x10;
          uVar23 = 0x10;
        }
        else {
          uVar23 = (ulong)(uint)(iVar22 * 2);
          if (vRoots->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(uVar23 * 8);
          }
          else {
            ppvVar7 = (void **)realloc(vRoots->pArray,uVar23 * 8);
          }
          vRoots->pArray = ppvVar7;
          vRoots->nCap = iVar22 * 2;
        }
      }
      else {
        ppvVar7 = vRoots->pArray;
      }
      iVar22 = vRoots->nSize;
      iVar15 = iVar22 + 1;
      vRoots->nSize = iVar15;
      ppvVar7[iVar22] = pGVar2 + iVar1;
      uVar18 = uVar18 + 1;
    } while (uVar20 != uVar18);
  }
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
LAB_001eefd2:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  piVar8 = &vLeaves->nSize;
  *p->pTravIds = p->nTravIds;
  if (0 < vRoots->nSize) {
    lVar21 = 0;
    do {
      Gia_ManDupCones_rec(p,(Gia_Obj_t *)vRoots->pArray[lVar21],vLeaves,vNodes,vRoots);
      lVar21 = lVar21 + 1;
    } while (lVar21 < vRoots->nSize);
  }
  if (1 < (long)*piVar8) {
    qsort(vLeaves->pArray,(long)*piVar8,8,Gia_ObjCompareByCioId);
  }
  piVar9 = piVar8;
  if (fTrimPis == 0) {
    piVar9 = &p->vCis->nSize;
  }
  p_00 = Gia_ManStart(vRoots->nSize + *piVar9 + vNodes->nSize + 1);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar3);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar3);
  }
  p_00->pName = pcVar11;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar3);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar3);
  }
  p_00->pSpec = pcVar11;
  p->pObjs->Value = 0;
  if (fTrimPis == 0) {
    pVVar13 = p->vCis;
    uVar18 = (ulong)(uint)pVVar13->nSize;
    if (p->nRegs < pVVar13->nSize) {
      lVar21 = 0;
      do {
        if ((int)uVar18 <= lVar21) goto LAB_001ef02f;
        iVar15 = pVVar13->pArray[lVar21];
        if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_001eeff1;
        pGVar2 = p->pObjs;
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        pGVar14 = Gia_ManAppendObj(p_00);
        uVar18 = *(ulong *)pGVar14;
        *(ulong *)pGVar14 = uVar18 | 0x9fffffff;
        *(ulong *)pGVar14 =
             uVar18 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar12 = p_00->pObjs;
        if ((pGVar14 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar14)) goto LAB_001eefd2;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar14 - (long)pGVar12) >> 2) * -0x55555555);
        pGVar12 = p_00->pObjs;
        if ((pGVar14 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar14)) goto LAB_001eefd2;
        pGVar2[iVar15].Value = (int)((ulong)((long)pGVar14 - (long)pGVar12) >> 2) * 0x55555556;
        lVar21 = lVar21 + 1;
        pVVar13 = p->vCis;
        uVar18 = (ulong)pVVar13->nSize;
      } while (lVar21 < (long)(uVar18 - (long)p->nRegs));
    }
  }
  else if (0 < *piVar8) {
    lVar21 = 0;
    do {
      pvVar4 = vLeaves->pArray[lVar21];
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar18 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p_00->pObjs;
      if ((pGVar12 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar12)) goto LAB_001eefd2;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar12 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar12)) goto LAB_001eefd2;
      *(int *)((long)pvVar4 + 8) = (int)((ulong)((long)pGVar12 - (long)pGVar2) >> 2) * 0x55555556;
      lVar21 = lVar21 + 1;
    } while (lVar21 < *piVar8);
  }
  iVar15 = vRoots->nSize;
  if (nPos < iVar15) {
    do {
      if (nPos < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar5 = (undefined8 *)vRoots->pArray[uVar20];
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar18 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p_00->pObjs;
      if ((pGVar12 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar12)) goto LAB_001eefd2;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar12 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar12)) goto LAB_001eefd2;
      uVar16 = (uint)*puVar5;
      if ((-1 < (int)uVar16) || ((uVar16 & 0x1fffffff) == 0x1fffffff)) {
LAB_001ef04e:
        __assert_fail("Gia_ObjIsRi(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1fe,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar16 = (uint)((ulong)*puVar5 >> 0x20) & 0x1fffffff;
      iVar15 = p->vCos->nSize;
      if ((int)uVar16 < iVar15 - p->nRegs) goto LAB_001ef04e;
      iVar1 = p->vCis->nSize;
      uVar16 = (iVar1 - iVar15) + uVar16;
      if (((int)uVar16 < 0) || (iVar1 <= (int)uVar16)) {
LAB_001ef02f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar15 = p->vCis->pArray[uVar16];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) {
LAB_001eeff1:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      p->pObjs[iVar15].Value = (int)((ulong)((long)pGVar12 - (long)pGVar2) >> 2) * 0x55555556;
      uVar20 = uVar20 + 1;
      iVar15 = vRoots->nSize;
    } while ((int)uVar20 < iVar15);
  }
  if (0 < vNodes->nSize) {
    lVar21 = 0;
    do {
      puVar6 = (ulong *)vNodes->pArray[lVar21];
      uVar20 = *puVar6;
      uVar18 = uVar20 & 0x1fffffff;
      uVar16 = (uint)(uVar20 >> 0x20);
      if ((uVar18 == 0x1fffffff || (int)(uint)uVar20 < 0) ||
         ((uVar16 & 0x1fffffff) <= ((uint)uVar20 & 0x1fffffff))) {
        uVar19 = *(uint *)((long)puVar6 + uVar18 * -0xc + 8);
        if (((int)uVar19 < 0) ||
           (uVar17 = *(uint *)((long)puVar6 + (ulong)(uVar16 & 0x1fffffff) * -0xc + 8),
           (int)uVar17 < 0)) goto LAB_001ef010;
        iVar15 = Gia_ManAppendAnd(p_00,uVar19 ^ (uint)(uVar20 >> 0x1d) & 1,
                                  uVar17 ^ uVar16 >> 0x1d & 1);
      }
      else {
        uVar19 = *(uint *)((long)puVar6 + uVar18 * -0xc + 8);
        if (((int)uVar19 < 0) ||
           (uVar17 = *(uint *)((long)puVar6 + (ulong)(uVar16 & 0x1fffffff) * -0xc + 8),
           (int)uVar17 < 0)) goto LAB_001ef010;
        uVar17 = uVar17 ^ uVar16 >> 0x1d & 1;
        iVar15 = Gia_ManAppendMux(p_00,uVar19 ^ (uint)(uVar20 >> 0x1d) & 1,uVar17 ^ 1,uVar17);
      }
      *(int *)(puVar6 + 1) = iVar15;
      lVar21 = lVar21 + 1;
    } while (lVar21 < vNodes->nSize);
    iVar15 = vRoots->nSize;
  }
  if (0 < iVar15) {
    lVar21 = 0;
    do {
      uVar19 = (uint)*vRoots->pArray[lVar21];
      uVar16 = *(uint *)((long)vRoots->pArray[lVar21] + (ulong)(uVar19 & 0x1fffffff) * -0xc + 8);
      if ((int)uVar16 < 0) {
LAB_001ef010:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar19 >> 0x1d & 1 ^ uVar16);
      lVar21 = lVar21 + 1;
      iVar15 = vRoots->nSize;
    } while (lVar21 < iVar15);
  }
  Gia_ManSetRegNum(p_00,iVar15 - nPos);
  if (vLeaves->pArray != (void **)0x0) {
    free(vLeaves->pArray);
  }
  free(vLeaves);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  if (vRoots->pArray != (void **)0x0) {
    free(vRoots->pArray);
  }
  free(vRoots);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupCones( Gia_Man_t * p, int * pPos, int nPos, int fTrimPis )
{
    Gia_Man_t * pNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Gia_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_PtrPush( vRoots, Gia_ManPo(p, pPos[i]) );

    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManDupCones_rec( p, pObj, vLeaves, vNodes, vRoots );
    Vec_PtrSort( vLeaves, (int (*)(void))Gia_ObjCompareByCioId );

    // start the new manager
//    Gia_ManFillValue( p );
    pNew = Gia_ManStart( (fTrimPis ? Vec_PtrSize(vLeaves) : Gia_ManCiNum(p)) + Vec_PtrSize(vNodes) + Vec_PtrSize(vRoots) + 1 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map the constant node
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    if ( fTrimPis )
    {
        Vec_PtrForEachEntry( Gia_Obj_t *, vLeaves, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create LOs
    Vec_PtrForEachEntryStart( Gia_Obj_t *, vRoots, pObj, i, nPos )
        Gia_ObjRiToRo(p, pObj)->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Vec_PtrForEachEntry( Gia_Obj_t *, vNodes, pObj, i )
        if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // finalize
    Gia_ManSetRegNum( pNew, Vec_PtrSize(vRoots)-nPos );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pNew;

}